

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doh.c
# Opt level: O3

CURLcode Curl_doh_is_resolved(Curl_easy *data,Curl_dns_entry **dnsp)

{
  dnsprobe *datap;
  dynbuf *s;
  byte bVar1;
  DNStype DVar2;
  int iVar3;
  dohdata *pdVar4;
  sockaddr *psVar5;
  undefined8 uVar6;
  int iVar7;
  ushort uVar8;
  ushort rdlength;
  DOHcode DVar9;
  uchar *puVar10;
  size_t sVar11;
  size_t sVar12;
  Curl_addrinfo *pCVar13;
  Curl_dns_entry *pCVar14;
  sa_family_t sVar15;
  char *pcVar16;
  uint uVar17;
  char *pcVar18;
  bool bVar19;
  int iVar20;
  long lVar21;
  CURLcode CVar22;
  ushort type;
  long lVar23;
  uint uVar24;
  size_t sVar25;
  anon_union_16_2_f9ece763_for_ip *paVar26;
  uint *puVar27;
  dohentry *pdVar28;
  ulong uVar29;
  Curl_addrinfo *pCVar30;
  bool bVar31;
  dohentry de;
  Curl_addrinfo *local_378;
  uint local_340;
  uint local_33c;
  size_t local_338;
  Curl_dns_entry **local_330;
  uint local_328 [2];
  char local_31e [126];
  dohentry local_2a0;
  
  pdVar4 = (data->req).doh;
  *dnsp = (Curl_dns_entry *)0x0;
  if (pdVar4 == (dohdata *)0x0) {
    CVar22 = CURLE_OUT_OF_MEMORY;
  }
  else if ((pdVar4->probe[0].easy == (CURL_conflict *)0x0) &&
          (pdVar4->probe[1].easy == (CURL_conflict *)0x0)) {
    Curl_failf(data,"Could not DoH-resolve: %s",(data->state).async.hostname);
    CVar22 = (((uint)data->conn->bits & 0x20) == 0) + CURLE_COULDNT_RESOLVE_PROXY;
  }
  else {
    CVar22 = CURLE_OK;
    if (pdVar4->pending == 0) {
      datap = pdVar4->probe;
      lVar21 = 0;
      local_340 = 0;
      local_33c = 0;
      local_330 = dnsp;
      curl_multi_remove_handle(data->multi,pdVar4->probe[0].easy);
      Curl_close(&datap->easy);
      curl_multi_remove_handle(data->multi,pdVar4->probe[1].easy);
      Curl_close(&pdVar4->probe[1].easy);
      memset(&local_2a0,0,0x270);
      local_2a0.ttl = 0x7fffffff;
      do {
        Curl_dyn_init((dynbuf *)((long)&local_2a0.cname[0].bufr + lVar21),0x100);
        lVar21 = lVar21 + 0x20;
      } while (lVar21 != 0x80);
      puVar27 = &local_340;
      lVar21 = 0;
      bVar19 = true;
LAB_00155747:
      if (pdVar4->probe[lVar21].dnstype != 0) {
        s = &datap[lVar21].serverdoh;
        puVar10 = Curl_dyn_uptr(s);
        sVar11 = Curl_dyn_len(s);
        uVar29 = 4;
        if ((((0xb < sVar11) && (uVar29 = 0xc, puVar10 != (uchar *)0x0)) && (*puVar10 == '\0')) &&
           ((puVar10[1] == '\0' && (uVar29 = 8, (puVar10[3] & 0xf) == 0)))) {
          DVar2 = datap[lVar21].dnstype;
          sVar25 = 0xc;
          for (uVar8 = *(ushort *)(puVar10 + 4) << 8 | *(ushort *)(puVar10 + 4) >> 8; uVar8 != 0;
              uVar8 = uVar8 - 1) {
            do {
              uVar24 = (int)sVar25 + 1;
              if (sVar11 < uVar24) goto LAB_00155ae4;
              bVar1 = puVar10[sVar25];
              if ((bVar1 & 0xc0) != 0) {
                uVar29 = 1;
                if ((bVar1 & 0xc0) != 0xc0) goto LAB_00155aea;
                uVar24 = (int)sVar25 + 2;
                if (sVar11 < uVar24) goto LAB_00155ae4;
                break;
              }
              uVar24 = uVar24 + bVar1;
              sVar25 = (size_t)uVar24;
              if (sVar11 < sVar25) goto LAB_00155ae4;
            } while (bVar1 != 0);
            sVar25 = (size_t)(uVar24 + 4);
            uVar29 = 2;
            if (sVar11 < sVar25) goto LAB_00155aea;
          }
          uVar8 = *(ushort *)(puVar10 + 6) << 8 | *(ushort *)(puVar10 + 6) >> 8;
          if (uVar8 == 0) {
            bVar31 = true;
          }
          else {
LAB_0015585c:
            do {
              uVar24 = (int)sVar25 + 1;
              if (sVar11 < uVar24) goto LAB_00155ae4;
              bVar1 = puVar10[sVar25];
              if ((bVar1 & 0xc0) == 0) {
                uVar24 = uVar24 + bVar1;
                if (sVar11 < uVar24) goto LAB_00155ae4;
                sVar25 = (size_t)uVar24;
                if (bVar1 != 0) goto LAB_0015585c;
              }
              else {
                uVar29 = 1;
                if ((bVar1 & 0xc0) != 0xc0) goto LAB_00155aea;
                uVar24 = (int)sVar25 + 2;
                if (sVar11 < uVar24) goto LAB_00155ae4;
              }
              if (sVar11 < uVar24 + 2) goto LAB_00155ae4;
              type = *(ushort *)(puVar10 + (int)uVar24) << 8 |
                     *(ushort *)(puVar10 + (int)uVar24) >> 8;
              if (((type != 5) && (type != DNS_TYPE_DNAME)) && (DVar2 != type)) {
                uVar29 = 9;
                goto LAB_00155aea;
              }
              if (sVar11 < uVar24 + 4) goto LAB_00155ae4;
              if ((ushort)(*(ushort *)(puVar10 + (int)(uVar24 + 2)) << 8 |
                          *(ushort *)(puVar10 + (int)(uVar24 + 2)) >> 8) != 1) {
                uVar29 = 10;
                goto LAB_00155aea;
              }
              if (sVar11 < uVar24 + 8) goto LAB_00155ae4;
              uVar17 = *(uint *)(puVar10 + (int)(uVar24 + 4));
              uVar17 = uVar17 >> 0x18 | (uVar17 & 0xff0000) >> 8 | (uVar17 & 0xff00) << 8 |
                       uVar17 << 0x18;
              if (uVar17 < local_2a0.ttl) {
                local_2a0.ttl = uVar17;
              }
              uVar17 = uVar24 + 10;
              if (sVar11 < uVar17) goto LAB_00155ae4;
              rdlength = *(ushort *)(puVar10 + (int)(uVar24 + 8)) << 8 |
                         *(ushort *)(puVar10 + (int)(uVar24 + 8)) >> 8;
              sVar25 = (size_t)(uVar17 + rdlength);
              uVar29 = 2;
              if (sVar11 < sVar25) goto LAB_00155aea;
              local_338 = CONCAT62(local_338._2_6_,uVar8);
              DVar9 = rdata(puVar10,sVar11,rdlength,type,uVar17,&local_2a0);
              if (DVar9 != DOH_OK) goto LAB_00155bbd;
              uVar8 = (short)local_338 - 1;
            } while (uVar8 != 0);
            bVar31 = type != 2;
          }
          local_328[0] = (uint)sVar25;
          uVar24 = local_328[0];
          for (uVar8 = *(ushort *)(puVar10 + 8) << 8 | *(ushort *)(puVar10 + 8) >> 8; uVar8 != 0;
              uVar8 = uVar8 - 1) {
            do {
              uVar24 = (int)sVar25 + 1;
              if (sVar11 < uVar24) goto LAB_00155ae4;
              bVar1 = puVar10[sVar25];
              if ((bVar1 & 0xc0) != 0) {
                uVar29 = 1;
                if ((bVar1 & 0xc0) != 0xc0) goto LAB_00155aea;
                uVar24 = (int)sVar25 + 2;
                if (sVar11 < uVar24) goto LAB_00155ae4;
                break;
              }
              uVar24 = uVar24 + bVar1;
              if (sVar11 < uVar24) goto LAB_00155ae4;
              sVar25 = (size_t)uVar24;
            } while (bVar1 != 0);
            if ((sVar11 < uVar24 + 8) || (sVar11 < uVar24 + 10)) goto LAB_00155ae4;
            uVar24 = (uint)(ushort)(*(ushort *)(puVar10 + (int)(uVar24 + 8)) << 8 |
                                   *(ushort *)(puVar10 + (int)(uVar24 + 8)) >> 8) + uVar24 + 10;
            sVar25 = (size_t)uVar24;
            uVar29 = 2;
            if (sVar11 < sVar25) goto LAB_00155aea;
          }
          local_328[0] = uVar24;
          for (uVar8 = *(ushort *)(puVar10 + 10) << 8 | *(ushort *)(puVar10 + 10) >> 8; uVar8 != 0;
              uVar8 = uVar8 - 1) {
            DVar9 = skipqname(puVar10,sVar11,local_328);
            if (DVar9 != DOH_OK) goto LAB_00155bbd;
            uVar29 = 2;
            if ((sVar11 < local_328[0] + 8) || (sVar11 < local_328[0] + 10)) goto LAB_00155aea;
            uVar24 = (uint)(ushort)(*(ushort *)(puVar10 + (int)(local_328[0] + 8)) << 8 |
                                   *(ushort *)(puVar10 + (int)(local_328[0] + 8)) >> 8) +
                     local_328[0] + 10;
            sVar25 = (size_t)uVar24;
            if (sVar11 < sVar25) goto LAB_00155aea;
            local_328[0] = uVar24;
          }
          uVar29 = 7;
          if (sVar11 == sVar25) {
            uVar24 = 0;
            if (local_2a0.numaddr == 0 && local_2a0.numcname == 0) {
              uVar24 = 0xb;
            }
            if (!bVar31) {
              uVar24 = 0;
            }
            uVar29 = (ulong)uVar24;
          }
        }
        goto LAB_00155aea;
      }
      goto LAB_00155b61;
    }
  }
  return CVar22;
LAB_00155ae4:
  uVar29 = 2;
  goto LAB_00155aea;
LAB_00155bbd:
  uVar29 = (ulong)DVar9;
LAB_00155aea:
  uVar24 = (uint)uVar29;
  *puVar27 = uVar24;
  Curl_dyn_free(s);
  if (((data != (Curl_easy *)0x0) && (uVar24 != 0)) && (((data->set).field_0x8bd & 0x10) != 0)) {
    pcVar18 = "bad error code";
    if (uVar24 < 0xe) {
      pcVar18 = (char *)((long)&errors_rel + (long)(int)(&errors_rel)[uVar29]);
    }
    pcVar16 = "AAAA";
    if (datap[lVar21].dnstype == DNS_TYPE_A) {
      pcVar16 = "A";
    }
    Curl_infof(data,"DoH: %s type %s for %s",pcVar18,pcVar16,pdVar4->host);
  }
LAB_00155b61:
  lVar21 = 1;
  puVar27 = &local_33c;
  bVar31 = !bVar19;
  bVar19 = false;
  if (bVar31) goto LAB_00155be5;
  goto LAB_00155747;
LAB_00155be5:
  if ((local_340 == 0) || (CVar22 = CURLE_COULDNT_RESOLVE_HOST, local_33c == 0)) {
    if ((data != (Curl_easy *)0x0) &&
       ((((data->set).field_0x8bd & 0x10) != 0 &&
        (Curl_infof(data,"DoH Host name: %s",pdVar4->host), ((data->set).field_0x8bd & 0x10) != 0)))
       ) {
      Curl_infof(data,"TTL: %u seconds",(ulong)local_2a0.ttl);
    }
    if (0 < local_2a0.numaddr) {
      puVar10 = local_2a0.addr[0].ip.v4 + 1;
      lVar21 = 0;
      do {
        iVar20 = local_2a0.addr[lVar21].type;
        if (iVar20 == 0x1c) {
          curl_msnprintf((char *)local_328,0x80,"DoH AAAA: ");
          sVar11 = 0x76;
          uVar29 = 0xfffffffffffffffe;
          pcVar18 = local_31e;
          do {
            pcVar16 = ":";
            if (uVar29 == 0xfffffffffffffffe) {
              pcVar16 = "";
            }
            curl_msnprintf(pcVar18,sVar11,"%s%02x%02x",pcVar16,(ulong)puVar10[uVar29 + 1],
                           (ulong)puVar10[uVar29 + 2]);
            sVar12 = strlen(pcVar18);
            sVar11 = sVar11 - sVar12;
            pcVar18 = pcVar18 + sVar12;
            uVar29 = uVar29 + 2;
          } while (uVar29 < 0xe);
          if ((data != (Curl_easy *)0x0) && (((data->set).field_0x8bd & 0x10) != 0)) {
            Curl_infof(data,"%s",local_328);
          }
        }
        else if (((iVar20 == 1) && (data != (Curl_easy *)0x0)) &&
                (((data->set).field_0x8bd & 0x10) != 0)) {
          Curl_infof(data,"DoH A: %u.%u.%u.%u",(ulong)local_2a0.addr[lVar21].ip.v4[0],
                     (ulong)local_2a0.addr[lVar21].ip.v4[1],(ulong)local_2a0.addr[lVar21].ip.v4[2],
                     (ulong)local_2a0.addr[lVar21].ip.v4[3]);
        }
        lVar21 = lVar21 + 1;
        puVar10 = puVar10 + 0x14;
      } while (lVar21 < local_2a0.numaddr);
    }
    iVar20 = local_2a0.numcname;
    if (0 < local_2a0.numcname) {
      pdVar28 = &local_2a0;
      lVar21 = 0;
      do {
        if ((data != (Curl_easy *)0x0) && (((data->set).field_0x8bd & 0x10) != 0)) {
          pcVar18 = Curl_dyn_ptr(pdVar28->cname);
          Curl_infof(data,"CNAME: %s",pcVar18);
          iVar20 = local_2a0.numcname;
        }
        lVar21 = lVar21 + 1;
        pdVar28 = (dohentry *)(pdVar28->cname + 1);
      } while (lVar21 < iVar20);
    }
    iVar7 = local_2a0.numaddr;
    pcVar18 = pdVar4->host;
    iVar3 = pdVar4->port;
    sVar12 = strlen(pcVar18);
    if (iVar7 == 0) {
      CVar22 = CURLE_COULDNT_RESOLVE_HOST;
LAB_0015600c:
      pdVar28 = &local_2a0;
      if (iVar20 < 1) {
        return CVar22;
      }
      lVar21 = 0;
      do {
        Curl_dyn_free(pdVar28->cname);
        lVar21 = lVar21 + 1;
        pdVar28 = (dohentry *)(pdVar28->cname + 1);
      } while (lVar21 < local_2a0.numcname);
      return CVar22;
    }
    if (iVar7 < 1) {
      local_378 = (Curl_addrinfo *)0x0;
    }
    else {
      local_338 = sVar12 + 1;
      uVar8 = (ushort)iVar3;
      paVar26 = &local_2a0.addr[0].ip;
      lVar21 = 0;
      local_378 = (Curl_addrinfo *)0x0;
      pCVar30 = (Curl_addrinfo *)0x0;
      do {
        iVar20 = ((dohaddr *)((long)paVar26 + -4))->type;
        lVar23 = 0x1c;
        if (iVar20 != 0x1c) {
          lVar23 = 0x10;
        }
        pCVar13 = (Curl_addrinfo *)(*Curl_ccalloc)(1,sVar12 + 0x31 + lVar23);
        if (pCVar13 == (Curl_addrinfo *)0x0) {
          Curl_freeaddrinfo(local_378);
          CVar22 = CURLE_OUT_OF_MEMORY;
          iVar20 = local_2a0.numcname;
          goto LAB_0015600c;
        }
        pCVar13->ai_addr = (sockaddr *)(pCVar13 + 1);
        pcVar16 = (char *)((long)&pCVar13[1].ai_flags + lVar23);
        pCVar13->ai_canonname = pcVar16;
        memcpy(pcVar16,pcVar18,local_338);
        if (local_378 == (Curl_addrinfo *)0x0) {
          local_378 = pCVar13;
        }
        if (pCVar30 != (Curl_addrinfo *)0x0) {
          pCVar30->ai_next = pCVar13;
        }
        pCVar13->ai_family = (uint)(iVar20 == 0x1c) * 8 + 2;
        pCVar13->ai_socktype = 1;
        pCVar13->ai_addrlen = (curl_socklen_t)lVar23;
        psVar5 = pCVar13->ai_addr;
        if (iVar20 == 0x1c) {
          uVar6 = *(undefined8 *)((long)paVar26 + 8);
          *(undefined8 *)(psVar5->sa_data + 6) = *(undefined8 *)paVar26;
          psVar5[1].sa_family = (short)uVar6;
          psVar5[1].sa_data[0] = (char)((ulong)uVar6 >> 0x10);
          psVar5[1].sa_data[1] = (char)((ulong)uVar6 >> 0x18);
          psVar5[1].sa_data[2] = (char)((ulong)uVar6 >> 0x20);
          psVar5[1].sa_data[3] = (char)((ulong)uVar6 >> 0x28);
          psVar5[1].sa_data[4] = (char)((ulong)uVar6 >> 0x30);
          psVar5[1].sa_data[5] = (char)((ulong)uVar6 >> 0x38);
          sVar15 = 10;
        }
        else {
          *(undefined4 *)(psVar5->sa_data + 2) = *(undefined4 *)paVar26;
          sVar15 = 2;
        }
        psVar5->sa_family = sVar15;
        *(ushort *)psVar5->sa_data = uVar8 << 8 | uVar8 >> 8;
        lVar21 = lVar21 + 1;
        paVar26 = (anon_union_16_2_f9ece763_for_ip *)((long)paVar26 + 0x14);
        pCVar30 = pCVar13;
      } while (lVar21 < local_2a0.numaddr);
    }
    if (data->share != (Curl_share *)0x0) {
      Curl_share_lock(data,CURL_LOCK_DATA_DNS,CURL_LOCK_ACCESS_SINGLE);
    }
    pCVar14 = Curl_cache_addr(data,local_378,pdVar4->host,0,pdVar4->port);
    if (data->share != (Curl_share *)0x0) {
      Curl_share_unlock(data,CURL_LOCK_DATA_DNS);
    }
    if (pCVar14 == (Curl_dns_entry *)0x0) {
      Curl_freeaddrinfo(local_378);
    }
    else {
      (data->state).async.dns = pCVar14;
      *local_330 = pCVar14;
    }
    CVar22 = CURLE_OK;
  }
  if (0 < local_2a0.numcname) {
    pdVar28 = &local_2a0;
    lVar21 = 0;
    do {
      Curl_dyn_free(pdVar28->cname);
      lVar21 = lVar21 + 1;
      pdVar28 = (dohentry *)(pdVar28->cname + 1);
    } while (lVar21 < local_2a0.numcname);
  }
  (*Curl_cfree)((data->req).doh);
  (data->req).doh = (dohdata *)0x0;
  return CVar22;
}

Assistant:

CURLcode Curl_doh_is_resolved(struct Curl_easy *data,
                              struct Curl_dns_entry **dnsp)
{
  CURLcode result;
  struct dohdata *dohp = data->req.doh;
  *dnsp = NULL; /* defaults to no response */
  if(!dohp)
    return CURLE_OUT_OF_MEMORY;

  if(!dohp->probe[DOH_PROBE_SLOT_IPADDR_V4].easy &&
     !dohp->probe[DOH_PROBE_SLOT_IPADDR_V6].easy) {
    failf(data, "Could not DoH-resolve: %s", data->state.async.hostname);
    return CONN_IS_PROXIED(data->conn)?CURLE_COULDNT_RESOLVE_PROXY:
      CURLE_COULDNT_RESOLVE_HOST;
  }
  else if(!dohp->pending) {
    DOHcode rc[DOH_PROBE_SLOTS] = {
      DOH_OK, DOH_OK
    };
    struct dohentry de;
    int slot;
    /* remove DoH handles from multi handle and close them */
    for(slot = 0; slot < DOH_PROBE_SLOTS; slot++) {
      curl_multi_remove_handle(data->multi, dohp->probe[slot].easy);
      Curl_close(&dohp->probe[slot].easy);
    }
    /* parse the responses, create the struct and return it! */
    de_init(&de);
    for(slot = 0; slot < DOH_PROBE_SLOTS; slot++) {
      struct dnsprobe *p = &dohp->probe[slot];
      if(!p->dnstype)
        continue;
      rc[slot] = doh_decode(Curl_dyn_uptr(&p->serverdoh),
                            Curl_dyn_len(&p->serverdoh),
                            p->dnstype,
                            &de);
      Curl_dyn_free(&p->serverdoh);
#ifndef CURL_DISABLE_VERBOSE_STRINGS
      if(rc[slot]) {
        infof(data, "DoH: %s type %s for %s", doh_strerror(rc[slot]),
              type2name(p->dnstype), dohp->host);
      }
#endif
    } /* next slot */

    result = CURLE_COULDNT_RESOLVE_HOST; /* until we know better */
    if(!rc[DOH_PROBE_SLOT_IPADDR_V4] || !rc[DOH_PROBE_SLOT_IPADDR_V6]) {
      /* we have an address, of one kind or other */
      struct Curl_dns_entry *dns;
      struct Curl_addrinfo *ai;

      infof(data, "DoH Host name: %s", dohp->host);
      showdoh(data, &de);

      result = doh2ai(&de, dohp->host, dohp->port, &ai);
      if(result) {
        de_cleanup(&de);
        return result;
      }

      if(data->share)
        Curl_share_lock(data, CURL_LOCK_DATA_DNS, CURL_LOCK_ACCESS_SINGLE);

      /* we got a response, store it in the cache */
      dns = Curl_cache_addr(data, ai, dohp->host, 0, dohp->port);

      if(data->share)
        Curl_share_unlock(data, CURL_LOCK_DATA_DNS);

      if(!dns) {
        /* returned failure, bail out nicely */
        Curl_freeaddrinfo(ai);
      }
      else {
        data->state.async.dns = dns;
        *dnsp = dns;
        result = CURLE_OK;      /* address resolution OK */
      }
    } /* address processing done */

    /* Now process any build-specific attributes retrieved from DNS */

    /* All done */
    de_cleanup(&de);
    Curl_safefree(data->req.doh);
    return result;

  } /* !dohp->pending */

  /* else wait for pending DoH transactions to complete */
  return CURLE_OK;
}